

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

bool __thiscall PStatePointer::ReadValue(PStatePointer *this,FArchive *ar,void *addr)

{
  BYTE tag;
  byte local_19;
  
  FArchive::operator<<(ar,&local_19);
  if (local_19 == 0x11) {
    ::operator<<(ar,(FState **)addr);
  }
  else {
    PType::SkipValue(ar,(uint)local_19);
  }
  return local_19 == 0x11;
}

Assistant:

bool PStatePointer::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag == VAL_State)
	{
		ar << *(FState **)addr;
		return true;
	}
	SkipValue(ar, tag);
	return false;
}